

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2predicates.cc
# Opt level: O3

Vector3<long_double> *
s2pred::GetCircumcenter<long_double>
          (Vector3<long_double> *a,Vector3<long_double> *b,Vector3<long_double> *c,longdouble *error
          )

{
  Vector3<long_double> *in_RDI;
  longdouble lVar1;
  longdouble lVar2;
  longdouble lVar3;
  longdouble lVar4;
  longdouble lVar5;
  longdouble lVar6;
  longdouble lVar7;
  longdouble lVar8;
  longdouble lVar9;
  longdouble lVar10;
  longdouble lVar11;
  longdouble lVar12;
  longdouble lVar13;
  longdouble lVar14;
  longdouble lVar15;
  longdouble lVar16;
  longdouble lVar17;
  longdouble lVar18;
  longdouble lVar19;
  longdouble lVar20;
  
  lVar10 = *(longdouble *)b->c_;
  lVar1 = *(longdouble *)a->c_ - lVar10;
  lVar15 = *(longdouble *)(b->c_ + 1);
  lVar2 = *(longdouble *)a->c_ + lVar10;
  lVar3 = lVar10 - *(longdouble *)c->c_;
  lVar10 = *(longdouble *)c->c_ + lVar10;
  lVar4 = *(longdouble *)(a->c_ + 1) - lVar15;
  lVar5 = *(longdouble *)(a->c_ + 1) + lVar15;
  lVar6 = lVar15 - *(longdouble *)(c->c_ + 1);
  lVar15 = *(longdouble *)(c->c_ + 1) + lVar15;
  lVar12 = *(longdouble *)(b->c_ + 2);
  lVar7 = *(longdouble *)(a->c_ + 2) - lVar12;
  lVar8 = *(longdouble *)(a->c_ + 2) + lVar12;
  lVar9 = lVar12 - *(longdouble *)(c->c_ + 2);
  lVar12 = *(longdouble *)(c->c_ + 2) + lVar12;
  lVar13 = lVar4 * lVar8 - lVar5 * lVar7;
  lVar14 = lVar7 * lVar2 - lVar8 * lVar1;
  lVar18 = lVar1 * lVar5 - lVar2 * lVar4;
  lVar16 = lVar6 * lVar12 - lVar15 * lVar9;
  lVar19 = lVar9 * lVar10 - lVar12 * lVar3;
  lVar11 = lVar3 * lVar15 - lVar10 * lVar6;
  lVar17 = lVar8 * lVar14 - lVar5 * lVar18;
  lVar20 = lVar18 * lVar2 - lVar8 * lVar13;
  lVar2 = lVar5 * lVar13 - lVar2 * lVar14;
  lVar5 = lVar12 * lVar19 - lVar15 * lVar11;
  lVar8 = lVar11 * lVar10 - lVar12 * lVar16;
  lVar12 = lVar15 * lVar16 - lVar10 * lVar19;
  lVar10 = SQRT(lVar18 * lVar18 + lVar14 * lVar14 + lVar13 * lVar13);
  lVar15 = SQRT(lVar11 * lVar11 + lVar19 * lVar19 + lVar16 * lVar16);
  *error = (lVar10 + lVar15) * (longdouble)1.3343234061987978e-33 +
           ((SQRT(lVar9 * lVar9 + lVar6 * lVar6 + lVar3 * lVar3) +
            SQRT(lVar7 * lVar7 + lVar4 * lVar4 + lVar1 * lVar1)) * (longdouble)8.881784e-16 +
           (longdouble)3.1208336360941426e-18) * lVar10 * lVar15 +
           (longdouble)4.4510473808249057e-67;
  *(longdouble *)in_RDI->c_ = lVar20 * lVar12 - lVar2 * lVar8;
  *(longdouble *)(in_RDI->c_ + 1) = lVar2 * lVar5 - lVar12 * lVar17;
  *(longdouble *)(in_RDI->c_ + 2) = lVar17 * lVar8 - lVar5 * lVar20;
  return in_RDI;
}

Assistant:

Vector3<T> GetCircumcenter(const Vector3<T>& a, const Vector3<T>& b,
                           const Vector3<T>& c, T* error) {
  constexpr T T_ERR = rounding_epsilon<T>();

  // We compute the circumcenter using the intersection of the perpendicular
  // bisectors of AB and BC.  The formula is essentially
  //
  //    Z = ((A x B) x (A + B)) x ((B x C) x (B + C)),
  //
  // except that we compute the cross product (A x B) as (A - B) x (A + B)
  // (and similarly for B x C) since this is much more stable when the inputs
  // are unit vectors.
  Vector3<T> ab_diff = a - b, ab_sum = a + b;
  Vector3<T> bc_diff = b - c, bc_sum = b + c;
  Vector3<T> nab = ab_diff.CrossProd(ab_sum);
  T nab_len = nab.Norm();
  T ab_len = ab_diff.Norm();
  Vector3<T> nbc = bc_diff.CrossProd(bc_sum);
  T nbc_len = nbc.Norm();
  T bc_len = bc_diff.Norm();
  Vector3<T> mab = nab.CrossProd(ab_sum);
  Vector3<T> mbc = nbc.CrossProd(bc_sum);
  *error = (((16 + 24 * sqrt(3)) * T_ERR +
                8 * DBL_ERR * (ab_len + bc_len)) * nab_len * nbc_len +
               128 * sqrt(3) * DBL_ERR * T_ERR * (nab_len + nbc_len) +
               3 * 4096 * DBL_ERR * DBL_ERR * T_ERR * T_ERR);
  return mab.CrossProd(mbc);
}